

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O2

void __thiscall
TPZChunkVector<TPZGraphEl_*,_10>::Write
          (TPZChunkVector<TPZGraphEl_*,_10> *this,TPZStream *buf,int withclassid)

{
  TPZGraphEl **ppTVar1;
  uint64_t i;
  ulong nelem;
  uint64_t nObjects;
  
  nObjects = this->fNElements;
  (*buf->_vptr_TPZStream[6])(buf,&nObjects,1);
  for (nelem = 0; nelem < nObjects; nelem = nelem + 1) {
    ppTVar1 = operator[](this,nelem);
    TPZPersistenceManager::WritePointer(&(*ppTVar1)->super_TPZSavable,buf);
  }
  return;
}

Assistant:

void Write(TPZStream& buf, int withclassid) const override{
        uint64_t nObjects = this->NElements();
        buf.Write(&nObjects);
        for (uint64_t i = 0; i < nObjects; i++) {
            WriteInternal(this->operator [](i), buf, withclassid);
        }
    }